

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundingbox.h
# Opt level: O0

BoundingBox * BoundingBox::v3(Vector3f *v0,Vector3f *v1,Vector3f *v2)

{
  float fVar1;
  float *pfVar2;
  Vector3f *in_RCX;
  Vector3f *in_RDX;
  BoundingBox *in_RDI;
  int c_1;
  int c;
  Vector3f mx;
  Vector3f mi;
  Vector3f *in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  int local_40;
  int local_3c;
  Vector3f local_38;
  Vector3f local_2c [3];
  
  Vector3f::Vector3f((Vector3f *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
  Vector3f::Vector3f((Vector3f *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    pfVar2 = Vector3f::operator[](in_RDX,local_3c);
    fVar1 = *pfVar2;
    pfVar2 = Vector3f::operator[](local_2c,local_3c);
    if (fVar1 < *pfVar2) {
      pfVar2 = Vector3f::operator[](in_RDX,local_3c);
      fVar1 = *pfVar2;
      pfVar2 = Vector3f::operator[](local_2c,local_3c);
      *pfVar2 = fVar1;
    }
    pfVar2 = Vector3f::operator[](in_RDX,local_3c);
    in_stack_ffffffffffffff74 = *pfVar2;
    pfVar2 = Vector3f::operator[](&local_38,local_3c);
    if (*pfVar2 < in_stack_ffffffffffffff74) {
      pfVar2 = Vector3f::operator[](in_RDX,local_3c);
      in_stack_ffffffffffffff70 = *pfVar2;
      pfVar2 = Vector3f::operator[](&local_38,local_3c);
      *pfVar2 = in_stack_ffffffffffffff70;
    }
  }
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    pfVar2 = Vector3f::operator[](in_RCX,local_40);
    in_stack_ffffffffffffff6c = *pfVar2;
    pfVar2 = Vector3f::operator[](local_2c,local_40);
    if (in_stack_ffffffffffffff6c < *pfVar2) {
      pfVar2 = Vector3f::operator[](in_RCX,local_40);
      in_stack_ffffffffffffff68 = *pfVar2;
      pfVar2 = Vector3f::operator[](local_2c,local_40);
      *pfVar2 = in_stack_ffffffffffffff68;
    }
    pfVar2 = Vector3f::operator[](in_RCX,local_40);
    in_stack_ffffffffffffff64 = *pfVar2;
    pfVar2 = Vector3f::operator[](&local_38,local_40);
    if (*pfVar2 < in_stack_ffffffffffffff64) {
      pfVar2 = Vector3f::operator[](in_RCX,local_40);
      in_stack_ffffffffffffff60 = *pfVar2;
      pfVar2 = Vector3f::operator[](&local_38,local_40);
      *pfVar2 = in_stack_ffffffffffffff60;
    }
  }
  Vector3f::Vector3f((Vector3f *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
  Vector3f::Vector3f((Vector3f *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
  BoundingBox((BoundingBox *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              (Vector3f *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
              (Vector3f *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  return in_RDI;
}

Assistant:

static BoundingBox v3(Vector3f v0, Vector3f v1, Vector3f v2)
	{
		Vector3f mi = v0, mx = v0;
		for (int c = 0; c < 3; ++c)
		{
			if (v1[c] < mi[c]) mi[c] = v1[c];
			if (v1[c] > mx[c]) mx[c] = v1[c];
		}
		for (int c = 0; c < 3; ++c)
		{
			if (v2[c] < mi[c]) mi[c] = v2[c];
			if (v2[c] > mx[c]) mx[c] = v2[c];
		}
		return BoundingBox(mi, mx);
	}